

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_dispatch_loop.h
# Opt level: O3

void parse_dispatch(vw *all,dispatch_fptr *dispatch)

{
  int iVar1;
  undefined8 uVar2;
  vw_exception *this;
  ostream *poVar3;
  char *pcVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [12];
  example *local_60;
  v_array<example_*> local_58;
  
  local_58.end_array = (example **)0x0;
  local_58.erase_count = 0;
  local_58._begin = (example **)0x0;
  local_58._end = (example **)0x0;
  uVar6 = 0;
  do {
    if (all->p->done != false) {
LAB_001b4104:
      lock_done(all->p);
      if (local_58._begin != (example **)0x0) {
        free(local_58._begin);
      }
      return;
    }
    local_60 = VW::get_unused_example(all);
    v_array<example_*>::push_back(&local_58,&local_60);
    if (((all->do_reset_source == false) && (uVar6 != all->pass_length)) &&
       (uVar6 < all->max_examples)) {
      iVar1 = (*all->p->reader)(all,&local_58);
      if (iVar1 < 1) goto LAB_001b3f06;
      VW::setup_examples(all,&local_58);
      uVar7 = uVar6 + ((long)local_58._end - (long)local_58._begin >> 3);
      if ((dispatch->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001b3fd6;
      (*dispatch->_M_invoker)((_Any_data *)dispatch,all,&local_58);
    }
    else {
LAB_001b3f06:
      reset_source(all,(ulong)all->num_bits);
      all->do_reset_source = false;
      all->passes_complete = all->passes_complete + 1;
      (*(all->p->lp).default_label)(&(*local_58._begin)->l);
      (*local_58._begin)->end_pass = true;
      all->p->in_pass_counter = 0;
      if ((all->passes_complete == all->numpasses) && (uVar6 == all->pass_length)) {
        all->passes_complete = 0;
        all->pass_length = uVar6 * 2 + 1;
      }
      if ((dispatch->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
LAB_001b3fd6:
        auVar8 = std::__throw_bad_function_call();
        uVar2 = auVar8._0_8_;
        if (auVar8._8_4_ == 2) {
          this = (vw_exception *)__cxa_begin_catch(uVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"vw example #",0xc);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
          pcVar4 = VW::vw_exception::Filename(this);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
          iVar1 = VW::vw_exception::LineNumber(this);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
          pcVar4 = (char *)(**(code **)(*(long *)this + 0x10))(this);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          if (auVar8._8_4_ != 1) {
            _Unwind_Resume(uVar2);
          }
          plVar5 = (long *)__cxa_begin_catch(uVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"vw: example #",0xd);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          pcVar4 = (char *)(**(code **)(*plVar5 + 0x10))(plVar5);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        __cxa_end_catch();
        goto LAB_001b4104;
      }
      (*dispatch->_M_invoker)((_Any_data *)dispatch,all,&local_58);
      if (all->numpasses <= all->passes_complete) {
        uVar7 = 0;
        if (all->max_examples < uVar6) goto LAB_001b3fc1;
        lock_done(all->p);
      }
      uVar7 = 0;
    }
LAB_001b3fc1:
    v_array<example_*>::clear(&local_58);
    uVar6 = uVar7;
  } while( true );
}

Assistant:

inline void parse_dispatch(vw& all, dispatch_fptr dispatch)
{
  v_array<example*> examples = v_init<example*>();
  size_t example_number = 0;  // for variable-size batch learning algorithms

  try
  {
    while (!all.p->done)
    {
      examples.push_back(&VW::get_unused_example(&all));  // need at least 1 example
      if (!all.do_reset_source && example_number != all.pass_length && all.max_examples > example_number &&
          all.p->reader(&all, examples) > 0)
      {
        VW::setup_examples(all, examples);
        example_number += examples.size();
        dispatch(all, examples);
      }
      else
      {
        reset_source(all, all.num_bits);
        all.do_reset_source = false;
        all.passes_complete++;

        // setup an end_pass example
        all.p->lp.default_label(&examples[0]->l);
        examples[0]->end_pass = true;
        all.p->in_pass_counter = 0;

        if (all.passes_complete == all.numpasses && example_number == all.pass_length)
        {
          all.passes_complete = 0;
          all.pass_length = all.pass_length * 2 + 1;
        }
        dispatch(all, examples);  // must be called before lock_done or race condition exists.
        if (all.passes_complete >= all.numpasses && all.max_examples >= example_number)
          lock_done(*all.p);
        example_number = 0;
      }

      examples.clear();
    }
  }
  catch (VW::vw_exception& e)
  {
    std::cerr << "vw example #" << example_number << "(" << e.Filename() << ":" << e.LineNumber() << "): " << e.what()
              << std::endl;
  }
  catch (std::exception& e)
  {
    std::cerr << "vw: example #" << example_number << e.what() << std::endl;
  }
  lock_done(*all.p);
  examples.delete_v();
}